

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

void helper_shilo_mipsel(target_ulong_conflict ac,target_ulong_conflict rs,
                        CPUMIPSState_conflict4 *env)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = rs << 0x1a;
  if (iVar2 != 0) {
    uVar3 = CONCAT44((env->active_tc).HI[ac],(env->active_tc).LO[ac]);
    bVar1 = (byte)(iVar2 >> 0x1a);
    uVar4 = uVar3 << (-bVar1 & 0x3f);
    if (0 < iVar2 >> 0x1a) {
      uVar4 = uVar3 >> (bVar1 & 0x3f);
    }
    (env->active_tc).HI[ac] = (target_ulong_conflict)(uVar4 >> 0x20);
    (env->active_tc).LO[ac] = (target_ulong_conflict)uVar4;
  }
  return;
}

Assistant:

void helper_shilo(target_ulong ac, target_ulong rs, CPUMIPSState *env)
{
    int8_t  rs5_0;
    uint64_t temp, acc;

    rs5_0 = rs & 0x3F;
    rs5_0 = (int8_t)(rs5_0 << 2) >> 2;

    if (unlikely(rs5_0 == 0)) {
        return;
    }

    acc   = (((uint64_t)env->active_tc.HI[ac] << 32) & MIPSDSP_LHI) |
            ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);

    if (rs5_0 > 0) {
        temp = acc >> rs5_0;
    } else {
        temp = acc << -rs5_0;
    }

    env->active_tc.HI[ac] = (target_ulong)(int32_t)((temp & MIPSDSP_LHI) >> 32);
    env->active_tc.LO[ac] = (target_ulong)(int32_t)(temp & MIPSDSP_LLO);
}